

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool EV_StopPoly(int polynum)

{
  bool bVar1;
  FPolyObj *pFVar2;
  DPolyAction *this;
  FPolyObj *poly;
  int polynum_local;
  
  pFVar2 = PO_GetPolyobj(polynum);
  if (pFVar2 == (FPolyObj *)0x0) {
    poly._7_1_ = false;
  }
  else {
    bVar1 = TObjPtr<DPolyAction>::operator!=(&pFVar2->specialdata,(DPolyAction *)0x0);
    if (bVar1) {
      this = TObjPtr<DPolyAction>::operator->(&pFVar2->specialdata);
      DPolyAction::Stop(this);
    }
    poly._7_1_ = true;
  }
  return poly._7_1_;
}

Assistant:

bool EV_StopPoly(int polynum)
{
	FPolyObj *poly;

	if (NULL != (poly = PO_GetPolyobj(polynum)))
	{
		if (poly->specialdata != NULL)
		{
			poly->specialdata->Stop();
		}
		return true;
	}
	return false;
}